

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O2

void __thiscall
lsim::SimCircuit::write_output_pins(SimCircuit *this,uint32_t comp_id,value_container_t *values)

{
  SimComponent *this_00;
  pointer pVVar1;
  pointer pVVar2;
  uint uVar3;
  
  this_00 = component_by_id(this,comp_id);
  if (this_00 == (SimComponent *)0x0) {
    __assert_fail("comp",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x95,"void lsim::SimCircuit::write_output_pins(uint32_t, value_container_t)");
  }
  pVVar1 = (values->super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (values->super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar2 - (long)pVVar1 >> 2 ==
      (ulong)(this_00->m_control_start - this_00->m_output_start)) {
    for (uVar3 = 0; (ulong)uVar3 < (ulong)((long)pVVar2 - (long)pVVar1 >> 2); uVar3 = uVar3 + 1) {
      SimComponent::set_user_value(this_00,this_00->m_output_start + uVar3,pVVar1[uVar3]);
      pVVar1 = (values->super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (values->super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    return;
  }
  __assert_fail("values.size() == comp->num_outputs()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x97,"void lsim::SimCircuit::write_output_pins(uint32_t, value_container_t)");
}

Assistant:

void SimCircuit::write_output_pins(uint32_t comp_id, value_container_t values) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    assert(values.size() == comp->num_outputs());

    for (auto idx = 0u; idx < values.size(); ++idx) {
        comp->set_user_value(comp->output_pin_index(idx), values[idx]);
    }
}